

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O0

void upb_test_set_nest(upb_test_TestFreeze *msg,upb_test_TestFreeze *val,upb_Arena *arena)

{
  bool bVar1;
  upb_FieldRep uVar2;
  bool ok;
  upb_MiniTableExtension *ext;
  upb_Arena *arena_local;
  upb_test_TestFreeze *val_local;
  upb_test_TestFreeze *msg_local;
  
  arena_local = (upb_Arena *)val;
  val_local = msg;
  bVar1 = upb_MiniTableField_IsScalar(&upb_test_nest_ext.field_dont_copy_me__upb_internal_use_only);
  if (!bVar1) {
    __assert_fail("upb_MiniTableField_IsScalar(&ext->field_dont_copy_me__upb_internal_use_only)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/upb/message/test.upb.h"
                  ,0xccf,
                  "void upb_test_set_nest(struct upb_test_TestFreeze *, const upb_test_TestFreeze *, upb_Arena *)"
                 );
  }
  uVar2 = _upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only
                    (&upb_test_nest_ext.field_dont_copy_me__upb_internal_use_only);
  if (uVar2 == kUpb_FieldRep_8Byte) {
    bVar1 = upb_Message_SetExtension
                      (&val_local->base_dont_copy_me__upb_internal_use_only,&upb_test_nest_ext,
                       &arena_local,arena);
    if (bVar1) {
      return;
    }
    __assert_fail("ok",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/upb/message/test.upb.h"
                  ,0xcd3,
                  "void upb_test_set_nest(struct upb_test_TestFreeze *, const upb_test_TestFreeze *, upb_Arena *)"
                 );
  }
  __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only( &ext->field_dont_copy_me__upb_internal_use_only) == kUpb_FieldRep_8Byte"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/upb/message/test.upb.h"
                ,0xcd1,
                "void upb_test_set_nest(struct upb_test_TestFreeze *, const upb_test_TestFreeze *, upb_Arena *)"
               );
}

Assistant:

UPB_INLINE void upb_test_set_nest(struct upb_test_TestFreeze* msg, const upb_test_TestFreeze* val, upb_Arena* arena) {
  const upb_MiniTableExtension* ext = &upb_test_nest_ext;
  UPB_ASSUME(upb_MiniTableField_IsScalar(&ext->UPB_PRIVATE(field)));
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(
                 &ext->UPB_PRIVATE(field)) == UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte));
  bool ok = upb_Message_SetExtension((upb_Message*)msg, ext, &val, arena);
  UPB_ASSERT(ok);
}